

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O1

void __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
::next_semiintersection
          (semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
           *this)

{
  int iVar1;
  iterator_range<const_int_*> *piVar2;
  size_t sVar3;
  int *piVar4;
  int *piVar5;
  outer_range_iterator oVar6;
  
  do {
    oVar6._M_current = (this->m_begin)._M_current;
    if (oVar6._M_current == (this->m_end)._M_current) {
      return;
    }
    oVar6 = skip_while_less(this,oVar6,oVar6._M_current + (this->m_min_items - 1));
    piVar2 = (this->m_begin)._M_current;
    sVar3 = this->m_min_items;
    piVar4 = ((oVar6._M_current)->
             super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
             super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
             super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
             m_Begin;
    piVar5 = ((oVar6._M_current)->
             super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
             super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
             super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
             m_End;
    if (oVar6._M_current == piVar2 + (sVar3 - 1)) {
      if ((piVar4 == piVar5) ||
         (piVar5 = piVar2[sVar3 - 1].
                   super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                   .
                   super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                   .
                   super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                   .m_Begin,
         piVar5 == piVar2[sVar3 - 1].
                   super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                   .
                   super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                   .
                   super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                   .m_End)) {
LAB_0024c485:
        __assert_fail("!empty()","/usr/include/boost/range/iterator_range_core.hpp",0xff,
                      "reference boost::iterator_range_detail::iterator_range_base<const int *, boost::iterators::incrementable_traversal_tag>::front() const [IteratorT = const int *, TraversalTag = boost::iterators::incrementable_traversal_tag]"
                     );
      }
      iVar1 = *piVar5;
      if (iVar1 < *piVar4) {
        __assert_fail("not m_compare(skipped_until->front(), semiintersection_candidate()->front())"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                      ,0xf9,
                      "void burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const int *> *, std::vector<boost::iterator_range<const int *>>>, std::greater<void>>::next_semiintersection() [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<const int *> *, std::vector<boost::iterator_range<const int *>>>, Compare = std::greater<void>]"
                     );
      }
      if (*piVar4 < iVar1) {
        __assert_fail("not m_compare(semiintersection_candidate()->front(), skipped_until->front())"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                      ,0xfa,
                      "void burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const int *> *, std::vector<boost::iterator_range<const int *>>>, std::greater<void>>::next_semiintersection() [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<const int *> *, std::vector<boost::iterator_range<const int *>>>, Compare = std::greater<void>]"
                     );
      }
    }
    else if (piVar4 == piVar5) {
      drop_empty_range(this,oVar6);
    }
    else {
      piVar5 = piVar2[sVar3 - 1].
               super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
               .
               super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
               .m_Begin;
      if (piVar5 == piVar2[sVar3 - 1].
                    super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                    .
                    super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                    .
                    super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                    .m_End) goto LAB_0024c485;
      if (*piVar5 <= *piVar4) {
        __assert_fail("m_compare(semiintersection_candidate()->front(), skipped_until->front())",
                      "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                      ,0x103,
                      "void burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const int *> *, std::vector<boost::iterator_range<const int *>>>, std::greater<void>>::next_semiintersection() [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<const int *> *, std::vector<boost::iterator_range<const int *>>>, Compare = std::greater<void>]"
                     );
      }
      maintain_invariant(this);
    }
    if (oVar6._M_current == piVar2 + (sVar3 - 1)) {
      return;
    }
  } while( true );
}

Assistant:

void next_semiintersection ()
        {
            while (not is_end())
            {
                auto skipped_until = skip_while_less(m_begin, semiintersection_candidate());
                if (skipped_until == semiintersection_candidate())
                {
                    BOOST_ASSERT(not m_compare(skipped_until->front(), semiintersection_candidate()->front()));
                    BOOST_ASSERT(not m_compare(semiintersection_candidate()->front(), skipped_until->front()));
                    break; // Полупересечение найдено.
                }
                else if (skipped_until->empty())
                {
                    drop_empty_range(skipped_until);
                }
                else // Текущий диапазон больше кандидата.
                {
                    BOOST_ASSERT(m_compare(semiintersection_candidate()->front(), skipped_until->front()));
                    maintain_invariant();
                }
            }
        }